

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,StringRef name,StringRef attribute)

{
  ostream *poVar1;
  XmlEncode local_40;
  
  if (attribute.m_size != 0 && name.m_size != 0) {
    poVar1 = std::operator<<(this->m_os,' ');
    poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)name.m_start);
    poVar1 = std::operator<<(poVar1,"=\"");
    local_40.m_forWhat = ForAttributes;
    local_40.m_str.m_start = attribute.m_start;
    local_40.m_str.m_size = attribute.m_size;
    XmlEncode::encodeTo(&local_40,poVar1);
    std::operator<<(poVar1,'\"');
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( StringRef name,
                                          StringRef attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }